

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O2

void __thiscall
chrono::ChBodyEasyMesh::ChBodyEasyMesh
          (ChBodyEasyMesh *this,string *filename,double density,
          shared_ptr<chrono::ChMaterialSurface> *material,double sphere_swept,
          ChCollisionSystemType collision_type)

{
  shared_ptr<chrono::ChMaterialSurface> material_00;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  undefined1 local_50 [16];
  __shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (this->super_ChBodyAuxRef).super_ChBody.super_ChLoadableUVW =
       (ChLoadableUVW)&PTR__ChLoadable_011504f8;
  ChBodyAuxRef::ChBodyAuxRef
            (&this->super_ChBodyAuxRef,&PTR_construction_vtable_24__01154268,collision_type);
  (this->super_ChBodyAuxRef).super_ChBody.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)0x1153d08;
  (this->super_ChBodyAuxRef).super_ChBody.super_ChBodyFrame.super_ChFrameMoving<double>.
  super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x1154008;
  (this->super_ChBodyAuxRef).super_ChBody.super_ChContactable_1vars<6>.super_ChContactable.
  _vptr_ChContactable = (_func_int **)0x11540a0;
  (this->super_ChBodyAuxRef).super_ChBody.super_ChContactable_1vars<6>.
  super_ChVariableTupleCarrier_1vars<6>._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x458);
  (this->super_ChBodyAuxRef).super_ChBody.super_ChLoadableUVW = (ChLoadableUVW)0x11541d8;
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)&trimesh,filename,true,true);
  std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_40,
               &trimesh.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              );
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)local_50,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  material_00.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)density;
  material_00.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_50;
  SetupBody(this,(shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)&local_40,filename,density
            ,true,true,true,material_00,sphere_swept);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

ChBodyEasyMesh::ChBodyEasyMesh(const std::string& filename,
                               double density,
                               std::shared_ptr<ChMaterialSurface> material,
                               double sphere_swept,
                               collision::ChCollisionSystemType collision_type)
    : ChBodyAuxRef(collision_type) {
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(filename, true, true);
    SetupBody(trimesh, filename, density, true, true, true, material, sphere_swept);
}